

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

int __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::get_codepoint(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                *this)

{
  int iVar1;
  const_iterator piVar2;
  byte bVar3;
  bool local_69;
  int factor;
  const_iterator __end3;
  const_iterator __begin3;
  initializer_list<int> *__range3;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 local_30 [8];
  initializer_list<int> factors;
  int codepoint;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  
  if (this->current != 0x75) {
    __assert_fail("current == \'u\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                  ,0x8e1,
                  "int nlohmann::detail::lexer<nlohmann::basic_json<>>::get_codepoint() [BasicJsonType = nlohmann::basic_json<>]"
                 );
  }
  factors._M_len._4_4_ = 0;
  __range3._0_4_ = 0xc;
  __range3._4_4_ = 8;
  local_38 = 4;
  local_34 = 0;
  local_30 = (undefined1  [8])&__range3;
  factors._M_array = (iterator)0x4;
  __end3 = std::initializer_list<int>::begin((initializer_list<int> *)local_30);
  piVar2 = std::initializer_list<int>::end((initializer_list<int> *)local_30);
  do {
    if (__end3 == piVar2) {
      local_69 = factors._M_len._4_4_ < 0x10000;
      if (local_69) {
        return factors._M_len._4_4_;
      }
      __assert_fail("0x0000 <= codepoint and codepoint <= 0xFFFF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                    ,0x8f3,
                    "int nlohmann::detail::lexer<nlohmann::basic_json<>>::get_codepoint() [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
    iVar1 = *__end3;
    get(this);
    bVar3 = (byte)iVar1;
    if ((this->current < 0x30) || (0x39 < this->current)) {
      if ((this->current < 0x41) || (0x46 < this->current)) {
        if ((this->current < 0x61) || (0x66 < this->current)) {
          return -1;
        }
        iVar1 = this->current + -0x57 << (bVar3 & 0x1f);
      }
      else {
        iVar1 = this->current + -0x37 << (bVar3 & 0x1f);
      }
    }
    else {
      iVar1 = this->current + -0x30 << (bVar3 & 0x1f);
    }
    factors._M_len._4_4_ = iVar1 + factors._M_len._4_4_;
    __end3 = __end3 + 1;
  } while( true );
}

Assistant:

int get_codepoint() {
		// this function only makes sense after reading `\u`
		assert(current == 'u');
		int codepoint = 0;

		const auto factors = {12, 8, 4, 0};
		for (const auto factor : factors) {
			get();

			if (current >= '0' and current <= '9') {
				codepoint += ((current - 0x30) << factor);
			} else if (current >= 'A' and current <= 'F') {
				codepoint += ((current - 0x37) << factor);
			} else if (current >= 'a' and current <= 'f') {
				codepoint += ((current - 0x57) << factor);
			} else {
				return -1;
			}
		}

		assert(0x0000 <= codepoint and codepoint <= 0xFFFF);
		return codepoint;
	}